

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void EditTableSizingFlags(ImGuiTableFlags *p_flags)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  uint *in_RDI;
  float fVar4;
  int m;
  int n;
  char *preview_text;
  int idx;
  ImVec2 *in_stack_00000098;
  ImGuiSelectableFlags in_stack_000000a0;
  bool in_stack_000000a7;
  char *in_stack_000000a8;
  ImGuiComboFlags in_stack_0000010c;
  char *in_stack_00000110;
  char *in_stack_00000118;
  char *in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  ImGuiHoveredFlags flags;
  int local_28;
  ImVec2 local_24;
  int local_1c;
  char *local_18;
  int local_c;
  uint *local_8;
  
  local_c = 0;
  while ((local_c < 5 && (EditTableSizingFlags::policies[local_c].Value != (*in_RDI & 0xe000)))) {
    local_c = local_c + 1;
  }
  if (local_c < 5) {
    lVar3 = 0;
    if (0 < local_c) {
      lVar3 = 0xf;
    }
    pcVar2 = EditTableSizingFlags::policies[local_c].Name + lVar3;
  }
  else {
    pcVar2 = "";
  }
  local_18 = pcVar2;
  local_8 = in_RDI;
  bVar1 = ImGui::BeginCombo(in_stack_00000118,in_stack_00000110,in_stack_0000010c);
  flags = (ImGuiHoveredFlags)pcVar2;
  if (bVar1) {
    for (local_1c = 0; flags = (ImGuiHoveredFlags)pcVar2, local_1c < 5; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffc4 =
           (float)CONCAT13(local_c == local_1c,SUB43(in_stack_ffffffffffffffc4,0));
      ImVec2::ImVec2(&local_24,0.0,0.0);
      bVar1 = ImGui::Selectable(in_stack_000000a8,in_stack_000000a7,in_stack_000000a0,
                                in_stack_00000098);
      if (bVar1) {
        *local_8 = *local_8 & 0xffff1fff | EditTableSizingFlags::policies[local_1c].Value;
      }
    }
    ImGui::EndCombo();
  }
  ImGui::SameLine(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  ImGui::TextDisabled("(?)");
  bVar1 = ImGui::IsItemHovered(flags);
  if (bVar1) {
    ImGui::BeginTooltip();
    ImGui::GetFontSize();
    ImGui::PushTextWrapPos(in_stack_ffffffffffffffc4);
    for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
      ImGui::Separator();
      ImGui::Text("%s:",EditTableSizingFlags::policies[local_28].Name);
      ImGui::Separator();
      fVar4 = ImGui::GetCursorPosX();
      ImGui::GetStyle();
      ImGui::SetCursorPosX(in_stack_ffffffffffffffc4);
      ImGui::TextUnformatted
                ((char *)CONCAT44(in_stack_ffffffffffffffc4,fVar4),in_stack_ffffffffffffffb8);
    }
    ImGui::PopTextWrapPos();
    ImGui::EndTooltip();
  }
  return;
}

Assistant:

static void EditTableSizingFlags(ImGuiTableFlags* p_flags)
{
    struct EnumDesc { ImGuiTableFlags Value; const char* Name; const char* Tooltip; };
    static const EnumDesc policies[] =
    {
        { ImGuiTableFlags_None,               "Default",                            "Use default sizing policy:\n- ImGuiTableFlags_SizingFixedFit if ScrollX is on or if host window has ImGuiWindowFlags_AlwaysAutoResize.\n- ImGuiTableFlags_SizingStretchSame otherwise." },
        { ImGuiTableFlags_SizingFixedFit,     "ImGuiTableFlags_SizingFixedFit",     "Columns default to _WidthFixed (if resizable) or _WidthAuto (if not resizable), matching contents width." },
        { ImGuiTableFlags_SizingFixedSame,    "ImGuiTableFlags_SizingFixedSame",    "Columns are all the same width, matching the maximum contents width.\nImplicitly disable ImGuiTableFlags_Resizable and enable ImGuiTableFlags_NoKeepColumnsVisible." },
        { ImGuiTableFlags_SizingStretchProp,  "ImGuiTableFlags_SizingStretchProp",  "Columns default to _WidthStretch with weights proportional to their widths." },
        { ImGuiTableFlags_SizingStretchSame,  "ImGuiTableFlags_SizingStretchSame",  "Columns default to _WidthStretch with same weights." }
    };
    int idx;
    for (idx = 0; idx < IM_ARRAYSIZE(policies); idx++)
        if (policies[idx].Value == (*p_flags & ImGuiTableFlags_SizingMask_))
            break;
    const char* preview_text = (idx < IM_ARRAYSIZE(policies)) ? policies[idx].Name + (idx > 0 ? strlen("ImGuiTableFlags") : 0) : "";
    if (ImGui::BeginCombo("Sizing Policy", preview_text))
    {
        for (int n = 0; n < IM_ARRAYSIZE(policies); n++)
            if (ImGui::Selectable(policies[n].Name, idx == n))
                *p_flags = (*p_flags & ~ImGuiTableFlags_SizingMask_) | policies[n].Value;
        ImGui::EndCombo();
    }
    ImGui::SameLine();
    ImGui::TextDisabled("(?)");
    if (ImGui::IsItemHovered())
    {
        ImGui::BeginTooltip();
        ImGui::PushTextWrapPos(ImGui::GetFontSize() * 50.0f);
        for (int m = 0; m < IM_ARRAYSIZE(policies); m++)
        {
            ImGui::Separator();
            ImGui::Text("%s:", policies[m].Name);
            ImGui::Separator();
            ImGui::SetCursorPosX(ImGui::GetCursorPosX() + ImGui::GetStyle().IndentSpacing * 0.5f);
            ImGui::TextUnformatted(policies[m].Tooltip);
        }
        ImGui::PopTextWrapPos();
        ImGui::EndTooltip();
    }
}